

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNetlist.c
# Opt level: O0

Abc_Ntk_t * Abc_NtkToLogic(Abc_Ntk_t *pNtk)

{
  Abc_Obj_t *pAVar1;
  int iVar2;
  Abc_Obj_t *pAVar3;
  char *pName;
  Abc_Obj_t *pAVar4;
  Abc_Ntk_t *pAVar5;
  int local_38;
  int local_34;
  int k;
  int i;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pNtkNew;
  Abc_Ntk_t *pNtk_local;
  
  iVar2 = Abc_NtkIsStrash(pNtk);
  if (iVar2 == 0) {
    iVar2 = Abc_NtkIsNetlist(pNtk);
    if (iVar2 == 0) {
      __assert_fail("Abc_NtkIsNetlist(pNtk)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcNetlist.c"
                    ,0x3c,"Abc_Ntk_t *Abc_NtkToLogic(Abc_Ntk_t *)");
    }
    iVar2 = Abc_NtkWhiteboxNum(pNtk);
    if (iVar2 != 0) {
      __assert_fail("Abc_NtkWhiteboxNum(pNtk) == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcNetlist.c"
                    ,0x3f,"Abc_Ntk_t *Abc_NtkToLogic(Abc_Ntk_t *)");
    }
    iVar2 = Abc_NtkBlackboxNum(pNtk);
    if (iVar2 != 0) {
      __assert_fail("Abc_NtkBlackboxNum(pNtk) == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcNetlist.c"
                    ,0x40,"Abc_Ntk_t *Abc_NtkToLogic(Abc_Ntk_t *)");
    }
    pNtk_local = Abc_NtkStartFrom(pNtk,ABC_NTK_LOGIC,pNtk->ntkFunc);
    for (local_34 = 0; iVar2 = Vec_PtrSize(pNtk->vObjs), local_34 < iVar2; local_34 = local_34 + 1)
    {
      pAVar3 = Abc_NtkObj(pNtk,local_34);
      if ((pAVar3 != (Abc_Obj_t *)0x0) && (iVar2 = Abc_ObjIsNode(pAVar3), iVar2 != 0)) {
        Abc_NtkDupObj(pNtk_local,pAVar3,0);
        pAVar1 = (pAVar3->field_6).pCopy;
        pAVar3 = Abc_ObjFanout0(pAVar3);
        pName = Abc_ObjName(pAVar3);
        Abc_ObjAssignName(pAVar1,pName,(char *)0x0);
      }
    }
    for (local_34 = 0; iVar2 = Vec_PtrSize(pNtk->vObjs), local_34 < iVar2; local_34 = local_34 + 1)
    {
      pAVar3 = Abc_NtkObj(pNtk,local_34);
      if ((pAVar3 != (Abc_Obj_t *)0x0) && (iVar2 = Abc_ObjIsNode(pAVar3), iVar2 != 0)) {
        for (local_38 = 0; iVar2 = Abc_ObjFaninNum(pAVar3), local_38 < iVar2;
            local_38 = local_38 + 1) {
          pAVar4 = Abc_ObjFanin(pAVar3,local_38);
          pAVar1 = (pAVar3->field_6).pCopy;
          pAVar4 = Abc_ObjFanin0(pAVar4);
          Abc_ObjAddFanin(pAVar1,(pAVar4->field_6).pCopy);
        }
      }
    }
    Abc_NtkFinalize(pNtk,pNtk_local);
    Abc_NtkLogicMakeSimpleCos(pNtk_local,0);
    if (pNtk->pExdc != (Abc_Ntk_t *)0x0) {
      pAVar5 = Abc_NtkToLogic(pNtk->pExdc);
      pNtk_local->pExdc = pAVar5;
    }
    iVar2 = Abc_NtkCheck(pNtk_local);
    if (iVar2 == 0) {
      fprintf(_stdout,"Abc_NtkToLogic(): Network check has failed.\n");
    }
  }
  else {
    pNtk_local = Abc_NtkAigToLogicSop(pNtk);
  }
  return pNtk_local;
}

Assistant:

Abc_Ntk_t * Abc_NtkToLogic( Abc_Ntk_t * pNtk )
{
    Abc_Ntk_t * pNtkNew; 
    Abc_Obj_t * pObj, * pFanin;
    int i, k;
    // consider the case of the AIG
    if ( Abc_NtkIsStrash(pNtk) )
        return Abc_NtkAigToLogicSop( pNtk );
    assert( Abc_NtkIsNetlist(pNtk) );
    // consider simple case when there is hierarchy
//    assert( pNtk->pDesign == NULL );
    assert( Abc_NtkWhiteboxNum(pNtk) == 0 );
    assert( Abc_NtkBlackboxNum(pNtk) == 0 );
    // start the network
    pNtkNew = Abc_NtkStartFrom( pNtk, ABC_NTK_LOGIC, pNtk->ntkFunc );
    // duplicate the nodes 
    Abc_NtkForEachNode( pNtk, pObj, i )
    {
        Abc_NtkDupObj(pNtkNew, pObj, 0);
        Abc_ObjAssignName( pObj->pCopy, Abc_ObjName(Abc_ObjFanout0(pObj)), NULL );
    }
    // reconnect the internal nodes in the new network
    Abc_NtkForEachNode( pNtk, pObj, i )
        Abc_ObjForEachFanin( pObj, pFanin, k )
            Abc_ObjAddFanin( pObj->pCopy, Abc_ObjFanin0(pFanin)->pCopy );
    // collect the CO nodes
    Abc_NtkFinalize( pNtk, pNtkNew );
    // fix the problem with CO pointing directly to CIs
    Abc_NtkLogicMakeSimpleCos( pNtkNew, 0 );
    // duplicate EXDC 
    if ( pNtk->pExdc )
        pNtkNew->pExdc = Abc_NtkToLogic( pNtk->pExdc );
    if ( !Abc_NtkCheck( pNtkNew ) )
        fprintf( stdout, "Abc_NtkToLogic(): Network check has failed.\n" );
    return pNtkNew;
}